

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O0

void __thiscall zmq::udp_engine_t::restart_output(udp_engine_t *this)

{
  udp_engine_t *in_stack_00000050;
  
  restart_output(in_stack_00000050);
  return;
}

Assistant:

void zmq::udp_engine_t::restart_output ()
{
    //  If we don't support send we just drop all messages
    if (!_send_enabled) {
        msg_t msg;
        while (_session->pull_msg (&msg) == 0)
            msg.close ();
    } else {
        set_pollout (_handle);
        out_event ();
    }
}